

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void auto_recover_compact_ok_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  char *__format;
  long lVar10;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_new;
  fdb_file_handle *dbfile_new;
  fdb_doc *local_4c8;
  size_t *local_4c0;
  fdb_doc *local_4b8 [2];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info info;
  char bodybuf [256];
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0x1000000;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./compact_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar4 = fdb_set_log_callback(db,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x45c);
    auto_recover_compact_ok_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x45c,"void auto_recover_compact_ok_test()");
  }
  fdb_open(&dbfile_new,"./compact_test1",&fconfig);
  fdb_kvs_open_default(dbfile_new,&db_new,&kvs_config);
  fVar4 = fdb_set_log_callback(db_new,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x461);
    auto_recover_compact_ok_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x461,"void auto_recover_compact_ok_test()");
  }
  uVar9 = 0;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 8) {
    sprintf(keybuf,"key%d",uVar9);
    sprintf(metabuf,"meta%d",uVar9);
    sprintf(bodybuf,"body%d",uVar9);
    sVar6 = strlen(keybuf);
    sVar7 = strlen(metabuf);
    sVar8 = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)&local_4c8 + lVar10),keybuf,sVar6,metabuf,sVar7,bodybuf,sVar8)
    ;
    fdb_set(db,*(fdb_doc **)((long)&local_4c8 + lVar10));
    uVar9 = (ulong)((int)uVar9 + 1);
  }
  fdb_doc_create(&rdoc,(void *)local_4c0[4],*local_4c0,(void *)local_4c0[7],local_4c0[1],(void *)0x0
                 ,0);
  rdoc->deleted = true;
  fdb_set(db,rdoc);
  fdb_doc_free(rdoc);
  fdb_commit(dbfile,'\x01');
  fdb_compact(dbfile,"./compact_test2");
  system("cp  compact_test1 compact_test11 > errorlog.txt");
  sprintf(keybuf,"key%d",2);
  sprintf(metabuf,"meta%d",2);
  sprintf(bodybuf,"body%d",2);
  sVar6 = strlen(keybuf);
  sVar7 = strlen(metabuf);
  sVar8 = strlen(bodybuf);
  fdb_doc_create(local_4b8,keybuf,sVar6,metabuf,sVar7,bodybuf,sVar8);
  fdb_set(db,local_4b8[0]);
  fdb_commit(dbfile,'\x01');
  fdb_kvs_close(db);
  fdb_kvs_close(db_new);
  fdb_close(dbfile);
  fdb_close(dbfile_new);
  system("mv  compact_test11 compact_test1 > errorlog.txt");
  fdb_open(&dbfile_new,"./compact_test1",&fconfig);
  fdb_kvs_open_default(dbfile_new,&db_new,&kvs_config);
  fVar4 = fdb_set_log_callback(db_new,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x498);
    auto_recover_compact_ok_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x498,"void auto_recover_compact_ok_test()");
  }
  lVar10 = 0;
  do {
    if (lVar10 == 3) {
      fdb_get_file_info(dbfile_new,&info);
      iVar5 = strcmp("./compact_test2",info.filename);
      if (iVar5 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x4ae);
        auto_recover_compact_ok_test()::__test_pass = '\x01';
        iVar5 = strcmp("./compact_test2",info.filename);
        if (iVar5 != 0) {
          __assert_fail("!strcmp(\"./compact_test2\", info.filename)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x4ae,"void auto_recover_compact_ok_test()");
        }
      }
      fdb_kvs_close(db_new);
      fdb_close(dbfile_new);
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        fdb_doc_free((&local_4c8)[lVar10]);
      }
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (auto_recover_compact_ok_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"auto recovery after compaction test");
      return;
    }
    fdb_doc_create(&rdoc,(&local_4c8)[lVar10]->key,(&local_4c8)[lVar10]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    fVar4 = fdb_get(db_new,rdoc);
    doc = rdoc;
    if (lVar10 == 1) {
      if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x4a5);
        auto_recover_compact_ok_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x4a5,"void auto_recover_compact_ok_test()");
      }
    }
    else {
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x4a1);
        auto_recover_compact_ok_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x4a1,"void auto_recover_compact_ok_test()");
      }
      pvVar1 = rdoc->meta;
      pfVar2 = (&local_4c8)[lVar10];
      pvVar3 = pfVar2->meta;
      iVar5 = bcmp(pvVar1,pvVar3,rdoc->metalen);
      if (iVar5 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x4a2);
        auto_recover_compact_ok_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x4a2,"void auto_recover_compact_ok_test()");
      }
      pvVar1 = doc->body;
      pvVar3 = pfVar2->body;
      iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
      if (iVar5 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x4a3);
        auto_recover_compact_ok_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x4a3,"void auto_recover_compact_ok_test()");
      }
    }
    fdb_doc_free(doc);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void auto_recover_compact_ok_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile, *dbfile_new;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_new;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "auto_recover_compact_ok_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "auto_recover_compact_ok_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert first two documents
    for (i=0;i<2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove second doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // save the old file after compaction is done ..
    r = system(SHELL_COPY " compact_test1 compact_test11 > errorlog.txt");
    (void)r;

    // now insert third doc: it should go to the newly compacted file.
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "body%d", i);
    fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
        (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[i]);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close both the db files ...
    fdb_kvs_close(db);
    fdb_kvs_close(db_new);
    fdb_close(dbfile);
    fdb_close(dbfile_new);

    // restore the old file after close is done ..
    r = system(SHELL_MOVE " compact_test11 compact_test1 > errorlog.txt");
    (void)r;

    // now open the old saved compacted file, it should automatically recover
    // and use the new file since compaction was done successfully
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "auto_recover_compact_ok_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents using the old handle and expect all 3 docs
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db_new, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check this handle's filename it should point to newly compacted file
    fdb_file_info info;
    fdb_get_file_info(dbfile_new, &info);
    TEST_CHK(!strcmp("./compact_test2", info.filename));

    // close the file
    fdb_kvs_close(db_new);
    fdb_close(dbfile_new);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("auto recovery after compaction test");
}